

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tag.hpp
# Opt level: O0

bool __thiscall
cfgfile::tag_t<cfgfile::string_trait_t>::is_defined(tag_t<cfgfile::string_trait_t> *this)

{
  bool bVar1;
  tag_t<cfgfile::string_trait_t> *this_00;
  reference pptVar2;
  vector<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>
  *in_RDI;
  tag_t<cfgfile::string_trait_t> *tag;
  const_iterator __end0;
  const_iterator __begin0;
  child_tags_list_t *__range2;
  tag_t<cfgfile::string_trait_t> *in_stack_ffffffffffffffd0;
  __normal_iterator<cfgfile::tag_t<cfgfile::string_trait_t>_*const_*,_std::vector<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>_>
  local_20;
  
  this_00 = (tag_t<cfgfile::string_trait_t> *)
            (*(code *)(in_RDI->
                      super__Vector_base<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>
                      )._M_impl.super__Vector_impl_data._M_start[2])();
  local_20._M_current =
       (tag_t<cfgfile::string_trait_t> **)
       std::
       vector<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>
       ::begin(in_RDI);
  std::
  vector<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>
  ::end(in_RDI);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<cfgfile::tag_t<cfgfile::string_trait_t>_*const_*,_std::vector<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>_>
                        *)in_stack_ffffffffffffffd0,
                       (__normal_iterator<cfgfile::tag_t<cfgfile::string_trait_t>_*const_*,_std::vector<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>_>
                        *)in_RDI);
    if (!bVar1) {
      return (bool)(*(byte *)((long)&in_RDI[1].
                                     super__Vector_base<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) & 1);
    }
    pptVar2 = __gnu_cxx::
              __normal_iterator<cfgfile::tag_t<cfgfile::string_trait_t>_*const_*,_std::vector<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>_>
              ::operator*(&local_20);
    in_stack_ffffffffffffffd0 = *pptVar2;
    bVar1 = is_mandatory(in_stack_ffffffffffffffd0);
    if ((bVar1) && (bVar1 = is_defined(this_00), !bVar1)) break;
    __gnu_cxx::
    __normal_iterator<cfgfile::tag_t<cfgfile::string_trait_t>_*const_*,_std::vector<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>_>
    ::operator++(&local_20);
  }
  return false;
}

Assistant:

bool is_defined() const
	{
		for( const tag_t< Trait > * tag : children() )
		{
			if( tag->is_mandatory() && !tag->is_defined() )
				return false;
		}

		return m_is_defined;
	}